

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  byte bVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImGuiTableSettings *p;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ImGuiTableColumn *pIVar9;
  long lVar10;
  byte *pbVar11;
  char *pcVar12;
  
  pIVar2 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x20) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      iVar8 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar2->SettingsTables,p);
      table->SettingsOffset = iVar8;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    uVar3 = p->SaveFlags;
    table->SettingsLoadedFlags = uVar3;
    table->RefScale = p->RefScale;
    cVar4 = p->ColumnsCount;
    if ('\0' < cVar4) {
      pbVar11 = (byte *)((long)&p[1].RefScale + 3);
      iVar8 = 0;
      do {
        bVar1 = pbVar11[-3];
        iVar6 = (int)(char)bVar1;
        if ((-1 < iVar6) && (iVar6 < table->ColumnsCount)) {
          pIVar9 = (table->Columns).Data + iVar6;
          if ((table->Columns).DataEnd <= pIVar9) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
            uVar3 = p->SaveFlags;
          }
          if ((uVar3 & 1) != 0) {
            (&pIVar9->WidthStretchWeight)[(*pbVar11 & 8) == 0] = *(float *)(pbVar11 + -0xb);
            pIVar9->AutoFitQueue = '\0';
          }
          if ((uVar3 & 2) != 0) {
            bVar1 = pbVar11[-2];
          }
          pIVar9->DisplayOrder = bVar1;
          bVar5 = (bool)(*pbVar11 >> 2 & 1);
          pIVar9->IsVisibleNextFrame = bVar5;
          pIVar9->IsVisible = bVar5;
          pIVar9->SortOrder = pbVar11[-1];
          pIVar9->SortDirection = *pbVar11 & 3;
          cVar4 = p->ColumnsCount;
        }
        iVar8 = iVar8 + 1;
        pbVar11 = pbVar11 + 0xc;
      } while (iVar8 < cVar4);
    }
    if (0 < table->ColumnsCount) {
      lVar7 = 0;
      lVar10 = 0;
      do {
        pIVar9 = (table->Columns).Data;
        if ((table->Columns).DataEnd <=
            (ImGuiTableColumn *)((long)&(pIVar9->ClipRect).Min.x + lVar7)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        pcVar12 = (table->DisplayOrderToIndex).Data + (&pIVar9->DisplayOrder)[lVar7];
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar12) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *pcVar12 = (char)lVar10;
        lVar10 = lVar10 + 1;
        lVar7 = lVar7 + 0x68;
      } while (lVar10 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;
    //IM_ASSERT(settings->ColumnsCount == table->ColumnsCount);

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->WidthStretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImS8)column_n;
        column->IsVisible = column->IsVisibleNextFrame = column_settings->IsVisible;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // FIXME-TABLE: Need to validate .ini data
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImS8)column_n;
}